

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

void __thiscall
duckdb::DatabaseInstance::AddExtensionInfo
          (DatabaseInstance *this,string *name,ExtensionLoadedInfo *info)

{
  pointer pcVar1;
  string *__p;
  mapped_type *pmVar2;
  pointer *__ptr;
  
  __p = (string *)operator_new(0x20);
  *(string **)__p = __p + 0x10;
  pcVar1 = (info->description)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            (__p,pcVar1,pcVar1 + (info->description)._M_string_length);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->loaded_extensions_info,name);
  ::std::
  __uniq_ptr_impl<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>_>::
  reset((__uniq_ptr_impl<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>_>
         *)&pmVar2->load_info,(pointer)__p);
  return;
}

Assistant:

void DatabaseInstance::AddExtensionInfo(const string &name, const ExtensionLoadedInfo &info) {
	loaded_extensions_info[name].load_info = make_uniq<ExtensionLoadedInfo>(info);
}